

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::csharp::WritePropertyDocComment
               (Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *in_stack_000000d8;
  Printer *in_stack_000000e0;
  
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(in_stack_000000e0,in_stack_000000d8);
  return;
}

Assistant:

void WritePropertyDocComment(io::Printer* printer, const FieldDescriptor* field) {
    WriteDocCommentBody(printer, field);
}